

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

int32 cmd_ln_parse_file(arg_t *defn,char *filename,int32 strict)

{
  cmd_ln_t *pcVar1;
  cmd_ln_t *cmdln;
  int32 strict_local;
  char *filename_local;
  arg_t *defn_local;
  
  pcVar1 = cmd_ln_parse_file_r(global_cmdln,defn,filename,strict);
  if (pcVar1 == (cmd_ln_t *)0x0) {
    defn_local._4_4_ = -1;
  }
  else {
    if (global_cmdln == (cmd_ln_t *)0x0) {
      global_cmdln = pcVar1;
    }
    defn_local._4_4_ = 0;
  }
  return defn_local._4_4_;
}

Assistant:

int
cmd_ln_parse_file(const arg_t * defn, const char *filename, int32 strict)
{
    cmd_ln_t *cmdln;

    cmdln = cmd_ln_parse_file_r(global_cmdln, defn, filename, strict);
    if (cmdln == NULL) {
        return -1;
    }
    /* Initialize global_cmdln if not present. */
    if (global_cmdln == NULL) {
        global_cmdln = cmdln;
    }
    return 0;
}